

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O1

void __thiscall Kraken::KClient::KClient(KClient *this)

{
  EVP_PKEY_CTX *ctx;
  char *__end;
  
  (this->key_)._M_dataplus._M_p = (pointer)&(this->key_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"","");
  (this->secret_)._M_dataplus._M_p = (pointer)&(this->secret_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->secret_,"","");
  (this->url_)._M_dataplus._M_p = (pointer)&(this->url_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->url_,"https://api.kraken.com","")
  ;
  (this->version_)._M_dataplus._M_p = (pointer)&(this->version_).field_2;
  ctx = (EVP_PKEY_CTX *)0x11d6bf;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->version_,"0","");
  init(this,ctx);
  return;
}

Assistant:

KClient::KClient() 
   :key_(""), secret_(""), url_("https://api.kraken.com"), version_("0") 
{ 
   init(); 
}